

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

int __thiscall fmt::v8::buffered_file::close(buffered_file *this,int __fd)

{
  int iVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  int result;
  buffered_file *this_local;
  
  if (this->file_ != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
    if (iVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x20);
      puVar3 = (uint *)__errno_location();
      fmt.str_.data_ = (char *)(ulong)*puVar3;
      fmt.str_.size_ = (size_t)"cannot close file";
      system_error<>((int)uVar2,fmt);
      __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return (int)this;
}

Assistant:

void buffered_file::close() {
  if (!file_) return;
  int result = FMT_SYSTEM(fclose(file_));
  file_ = nullptr;
  if (result != 0) FMT_THROW(system_error(errno, "cannot close file"));
}